

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcg64.hpp
# Opt level: O2

result_type trng::lcg64::f(result_type s,result_type a)

{
  uint uVar1;
  result_type rVar2;
  result_type rVar3;
  result_type rVar4;
  uint l;
  uint l_00;
  ulong uVar5;
  
  uVar5 = 0;
  if (s == 0) {
    rVar3 = 0;
  }
  else {
    uVar1 = log2_floor(s);
    rVar3 = 0;
    rVar4 = a;
    while (l_00 = (uint)uVar5, l_00 <= uVar1) {
      if ((s >> (uVar5 & 0x3f) & 1) != 0) {
        rVar2 = g(l_00,a);
        rVar3 = rVar3 * rVar4 + rVar2;
      }
      rVar4 = rVar4 * rVar4;
      uVar5 = (ulong)(l_00 + 1);
    }
  }
  return rVar3;
}

Assistant:

TRNG_CUDA_ENABLE
  inline lcg64::result_type lcg64::f(lcg64::result_type s, lcg64::result_type a) {
    if (s == 0)
      return 0;
    const unsigned int e{log2_floor(s)};
    lcg64::result_type y{0}, p{a};
    for (unsigned int l{0}; l <= e; ++l) {
      if (((1ull << l) & s) > 0) {
        y = g(l, a) + p * y;
      }
      p *= p;
    }
    return y;
  }